

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

TZDBTimeZoneNames * __thiscall
icu_63::TimeZoneFormat::getTZDBTimeZoneNames(TimeZoneFormat *this,UErrorCode *status)

{
  UBool UVar1;
  TZDBTimeZoneNames *this_00;
  UErrorCode *size;
  TZDBTimeZoneNames *local_60;
  TimeZoneFormat *nonConstThis;
  TZDBTimeZoneNames *tzdbNames;
  UErrorCode *status_local;
  TimeZoneFormat *this_local;
  
  size = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    umtx_lock_63((UMutex *)gLock);
    if (this->fTZDBTimeZoneNames == (TZDBTimeZoneNames *)0x0) {
      this_00 = (TZDBTimeZoneNames *)UMemory::operator_new((UMemory *)0xf0,(size_t)size);
      local_60 = (TZDBTimeZoneNames *)0x0;
      if (this_00 != (TZDBTimeZoneNames *)0x0) {
        TZDBTimeZoneNames::TZDBTimeZoneNames(this_00,&this->fLocale);
        local_60 = this_00;
      }
      if (local_60 == (TZDBTimeZoneNames *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        this->fTZDBTimeZoneNames = local_60;
      }
    }
    umtx_unlock_63((UMutex *)gLock);
    this_local = (TimeZoneFormat *)this->fTZDBTimeZoneNames;
  }
  else {
    this_local = (TimeZoneFormat *)0x0;
  }
  return (TZDBTimeZoneNames *)this_local;
}

Assistant:

const TZDBTimeZoneNames*
TimeZoneFormat::getTZDBTimeZoneNames(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return NULL;
    }

    umtx_lock(&gLock);
    if (fTZDBTimeZoneNames == NULL) {
        TZDBTimeZoneNames *tzdbNames = new TZDBTimeZoneNames(fLocale);
        if (tzdbNames == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            TimeZoneFormat *nonConstThis = const_cast<TimeZoneFormat *>(this);
            nonConstThis->fTZDBTimeZoneNames = tzdbNames;
        }
    }
    umtx_unlock(&gLock);

    return fTZDBTimeZoneNames;
}